

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bezier.cpp
# Opt level: O3

int __thiscall ON_BezierCurve::GetNurbForm(ON_BezierCurve *this,ON_NurbsCurve *n)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  double *pdVar6;
  double *pdVar7;
  int i;
  
  bVar3 = ON_NurbsCurve::Create(n,this->m_dim,this->m_is_rat != 0,this->m_order,this->m_order);
  uVar5 = 0;
  if (bVar3) {
    iVar4 = this->m_order;
    if (0 < iVar4) {
      iVar1 = this->m_dim;
      iVar2 = this->m_is_rat;
      i = 0;
      do {
        pdVar6 = ON_NurbsCurve::CV(n,i);
        pdVar7 = this->m_cv + (long)this->m_cv_stride * (long)i;
        if (this->m_cv == (double *)0x0) {
          pdVar7 = (double *)0x0;
        }
        memcpy(pdVar6,pdVar7,(long)(int)(((uint)(iVar2 != 0 && 0 < iVar1) + iVar1) * 8));
        i = i + 1;
        iVar4 = this->m_order;
      } while (i < iVar4);
    }
    pdVar6 = n->m_knot;
    pdVar7 = pdVar6 + (long)iVar4 + -2;
    *(undefined4 *)pdVar7 = 0;
    *(undefined4 *)((long)pdVar7 + 4) = 0;
    *(undefined4 *)(pdVar7 + 1) = 0;
    *(undefined4 *)((long)pdVar7 + 0xc) = 0x3ff00000;
    bVar3 = ON_ClampKnotVector(n->m_order,n->m_cv_count,pdVar6,2);
    uVar5 = (uint)bVar3;
  }
  return uVar5;
}

Assistant:

int ON_BezierCurve::GetNurbForm( ON_NurbsCurve& n ) const
{
  int rc = 0;
  if ( n.Create( m_dim, m_is_rat, m_order, m_order ) ) {
    const int sizeof_cv = CVSize()*sizeof(m_cv[0]);
    int i;
    for ( i = 0; i < m_order; i++ ) {
      memcpy( n.CV(i), CV(i), sizeof_cv );
    }
    n.m_knot[m_order-2] = 0.0;//m_domain.Min();
    n.m_knot[m_order-1] = 1.0;//m_domain.Max();
    rc = ON_ClampKnotVector(n.m_order, n.m_cv_count, n.m_knot, 2) ? 1 : 0;
  }
  return rc;
}